

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

uint __thiscall
CBlockPolicyEstimator::HighestTargetTracked(CBlockPolicyEstimator *this,FeeEstimateHorizon horizon)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock4,&this->m_cs_fee_estimator,"m_cs_fee_estimator",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
             ,0x2f9,false);
  if (LONG_HALFLIFE < horizon) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                  ,0x305,
                  "unsigned int CBlockPolicyEstimator::HighestTargetTracked(FeeEstimateHorizon) const"
                 );
  }
  lVar3 = *(long *)((long)&(this->super_CValidationInterface)._vptr_CValidationInterface +
                   *(long *)(&DAT_00cb7e40 + (ulong)horizon * 8));
  lVar4 = *(long *)(lVar3 + 0x30);
  lVar5 = *(long *)(lVar3 + 0x28);
  iVar1 = *(int *)(lVar3 + 0x78);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock4.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (int)((lVar4 - lVar5) / 0x18) * iVar1;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CBlockPolicyEstimator::HighestTargetTracked(FeeEstimateHorizon horizon) const
{
    LOCK(m_cs_fee_estimator);
    switch (horizon) {
    case FeeEstimateHorizon::SHORT_HALFLIFE: {
        return shortStats->GetMaxConfirms();
    }
    case FeeEstimateHorizon::MED_HALFLIFE: {
        return feeStats->GetMaxConfirms();
    }
    case FeeEstimateHorizon::LONG_HALFLIFE: {
        return longStats->GetMaxConfirms();
    }
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}